

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCenterLineProfileDef::~IfcCenterLineProfileDef
          (IfcCenterLineProfileDef *this)

{
  ~IfcCenterLineProfileDef(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

IfcCenterLineProfileDef() : Object("IfcCenterLineProfileDef") {}